

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

void __thiscall
DReachabilityPropagator::DReachabilityPropagator
          (DReachabilityPropagator *this,int _r,vec<BoolView> *_vs,vec<BoolView> *_es,
          vec<vec<int>_> *_in,vec<vec<int>_> *_out,vec<vec<int>_> *_en)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  vec<int> *pvVar8;
  reference this_00;
  reference pvVar9;
  ulong uVar10;
  ulong uVar11;
  Tint *pTVar12;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *_in_00;
  FilteredLT *pFVar13;
  BoolView *this_01;
  int in_ESI;
  DReachabilityPropagator *in_RDI;
  vec<vec<int>_> *in_R8;
  vec<vec<int>_> *in_R9;
  vec<vec<int>_> *in_stack_00000008;
  int i_8;
  int j_7;
  int i_7;
  uint j_6;
  uint i_6;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ou;
  uint j_5;
  uint i_5;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  in;
  uint j_4;
  uint i_4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  en;
  int e;
  int i_3;
  uint j_3;
  uint i_2;
  uint j_2;
  uint i_1;
  uint j_1;
  uint j;
  uint i;
  int in_stack_fffffffffffffa9c;
  uint uVar14;
  int in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffaa4;
  Propagator *in_stack_fffffffffffffaa8;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  undefined4 in_stack_fffffffffffffaf0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *_en_00;
  undefined1 *puVar15;
  undefined4 in_stack_fffffffffffffb48;
  FilteredLT *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  vec<BoolView> *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  GraphPropagator *in_stack_fffffffffffffb80;
  Tint *local_3e0;
  Tint *local_3b0;
  uint local_210;
  Reason local_208;
  int local_1fc;
  int local_1f8;
  undefined1 local_1f1;
  uint local_1a4;
  uint local_1a0;
  undefined1 local_199;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_198;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_180;
  uint local_164;
  uint local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_140;
  uint local_124;
  uint local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_f8;
  int local_dc;
  undefined4 local_d4;
  int local_b8;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  vec<vec<int>_> *local_30;
  vec<vec<int>_> *local_28;
  int local_c;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_c = in_ESI;
  GraphPropagator::GraphPropagator
            (in_stack_fffffffffffffb80,
             (vec<BoolView> *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             in_stack_fffffffffffffb70,
             (vec<vec<int>_> *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  (in_RDI->super_GraphPropagator).super_Propagator._vptr_Propagator =
       (_func_int **)&PTR__DReachabilityPropagator_0031fa90;
  in_RDI->lt = (FilteredLT *)0x0;
  in_RDI->root = local_c;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x2ad449);
  Tint::Tint(&in_RDI->in_nodes_tsize,0);
  in_RDI->in_nodes_size = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2ad487);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2ad4a3);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2ad4bf);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2ad4db);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2ad4f7);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x2ad513);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x2ad52f);
  vec<vec<int>_>::size(local_28);
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2ad582);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2ad597);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffac0,
           CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
           (value_type *)in_stack_fffffffffffffab0._pt,(allocator_type *)in_stack_fffffffffffffaa8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffffab0._pt,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffffaa8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffab0._pt);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2ad5f1);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt);
  for (local_80 = 0; uVar14 = local_80, uVar4 = vec<vec<int>_>::size(local_28), uVar14 < uVar4;
      local_80 = local_80 + 1) {
    local_84 = 0;
    while( true ) {
      uVar14 = local_84;
      pvVar8 = vec<vec<int>_>::operator[](local_28,local_80);
      uVar4 = vec<int>::size(pvVar8);
      if (uVar4 <= uVar14) break;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](&(in_RDI->super_GraphPropagator).adj,(ulong)local_80);
      pvVar8 = vec<vec<int>_>::operator[](local_28,local_80);
      vec<int>::operator[](pvVar8,local_84);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt,
                 (value_type_conflict *)in_stack_fffffffffffffaa8);
      local_84 = local_84 + 1;
    }
    local_88 = 0;
    while( true ) {
      uVar14 = local_88;
      pvVar8 = vec<vec<int>_>::operator[](local_30,local_80);
      uVar4 = vec<int>::size(pvVar8);
      if (uVar4 <= uVar14) break;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](&(in_RDI->super_GraphPropagator).adj,(ulong)local_80);
      pvVar8 = vec<vec<int>_>::operator[](local_30,local_80);
      vec<int>::operator[](pvVar8,local_88);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt,
                 (value_type_conflict *)in_stack_fffffffffffffaa8);
      local_88 = local_88 + 1;
    }
  }
  for (local_8c = 0; uVar14 = local_8c, uVar4 = vec<vec<int>_>::size(local_28), uVar14 < uVar4;
      local_8c = local_8c + 1) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::emplace_back<>((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
    local_90 = 0;
    while( true ) {
      uVar14 = local_90;
      pvVar8 = vec<vec<int>_>::operator[](local_28,local_8c);
      uVar4 = vec<int>::size(pvVar8);
      if (uVar4 <= uVar14) break;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](&in_RDI->in,(ulong)local_8c);
      pvVar8 = vec<vec<int>_>::operator[](local_28,local_8c);
      vec<int>::operator[](pvVar8,local_90);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt,
                 (value_type_conflict *)in_stack_fffffffffffffaa8);
      local_90 = local_90 + 1;
    }
  }
  for (local_94 = 0; uVar14 = local_94, uVar4 = vec<vec<int>_>::size(local_30), uVar14 < uVar4;
      local_94 = local_94 + 1) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::emplace_back<>((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
    local_98 = 0;
    while( true ) {
      uVar14 = local_98;
      pvVar8 = vec<vec<int>_>::operator[](local_30,local_94);
      uVar4 = vec<int>::size(pvVar8);
      if (uVar4 <= uVar14) break;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](&in_RDI->ou,(ulong)local_94);
      pvVar8 = vec<vec<int>_>::operator[](local_30,local_94);
      vec<int>::operator[](pvVar8,local_98);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt,
                 (value_type_conflict *)in_stack_fffffffffffffaa8);
      local_98 = local_98 + 1;
    }
  }
  GraphPropagator::nbNodes((GraphPropagator *)0x2adb79);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2adba8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffac0,
           CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
           (allocator_type *)in_stack_fffffffffffffab0._pt);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffffab0._pt,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffffaa8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffab0._pt);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2adbfd);
  for (local_b8 = 0; iVar7 = local_b8, iVar5 = GraphPropagator::nbNodes((GraphPropagator *)0x2adc23)
      , iVar7 < iVar5; local_b8 = local_b8 + 1) {
    GraphPropagator::nbNodes((GraphPropagator *)0x2adc4f);
    local_d4 = 0xffffffff;
    std::allocator<int>::allocator((allocator<int> *)0x2adc89);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffffac0,
               CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (value_type_conflict *)in_stack_fffffffffffffab0._pt,
               (allocator_type *)in_stack_fffffffffffffaa8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&in_RDI->nodes2edge,(long)local_b8);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffaa8);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt);
    std::allocator<int>::~allocator((allocator<int> *)0x2adcf6);
  }
  for (local_dc = 0; iVar7 = local_dc, iVar6 = GraphPropagator::nbEdges((GraphPropagator *)0x2add7e)
      , iVar5 = local_dc, iVar7 < iVar6; local_dc = local_dc + 1) {
    iVar7 = GraphPropagator::getTail
                      ((GraphPropagator *)
                       CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                       in_stack_fffffffffffffa9c);
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&in_RDI->nodes2edge,(long)iVar7);
    iVar7 = GraphPropagator::getHead
                      ((GraphPropagator *)
                       CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                       in_stack_fffffffffffffa9c);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar7);
    *pvVar9 = iVar5;
  }
  iVar7 = GraphPropagator::nbNodes((GraphPropagator *)0x2ade51);
  uVar10 = (ulong)iVar7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar10;
  uVar11 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pTVar12 = (Tint *)operator_new__(uVar11);
  if (uVar10 != 0) {
    local_3b0 = pTVar12;
    do {
      Tint::Tint(local_3b0);
      local_3b0 = local_3b0 + 1;
    } while (local_3b0 != pTVar12 + uVar10);
  }
  in_RDI->last_state_n = pTVar12;
  iVar7 = GraphPropagator::nbEdges((GraphPropagator *)0x2adf1c);
  uVar10 = (ulong)iVar7;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar10;
  uVar11 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pTVar12 = (Tint *)operator_new__(uVar11);
  if (uVar10 != 0) {
    local_3e0 = pTVar12;
    do {
      Tint::Tint(local_3e0);
      local_3e0 = local_3e0 + 1;
    } while (local_3e0 != pTVar12 + uVar10);
  }
  in_RDI->last_state_e = pTVar12;
  pTVar12 = in_RDI->last_state_n;
  iVar7 = GraphPropagator::nbNodes((GraphPropagator *)0x2adff6);
  memset(pTVar12,2,(long)iVar7 << 2);
  pTVar12 = in_RDI->last_state_e;
  iVar7 = GraphPropagator::nbEdges((GraphPropagator *)0x2ae03b);
  memset(pTVar12,2,(long)iVar7 << 2);
  GraphPropagator::nbEdges((GraphPropagator *)0x2ae071);
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2ae0b7);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2ae0cc);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffac0,
           CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
           (value_type *)in_stack_fffffffffffffab0._pt,(allocator_type *)in_stack_fffffffffffffaa8);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2ae100);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt);
  for (local_120 = 0; uVar14 = local_120, uVar4 = vec<vec<int>_>::size(in_stack_00000008),
      uVar14 < uVar4; local_120 = local_120 + 1) {
    local_124 = 0;
    while( true ) {
      uVar14 = local_124;
      pvVar8 = vec<vec<int>_>::operator[](in_stack_00000008,local_120);
      uVar4 = vec<int>::size(pvVar8);
      if (uVar4 <= uVar14) break;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](&local_f8,(ulong)local_120);
      pvVar8 = vec<vec<int>_>::operator[](in_stack_00000008,local_120);
      vec<int>::operator[](pvVar8,local_124);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt,
                 (value_type_conflict *)in_stack_fffffffffffffaa8);
      local_124 = local_124 + 1;
    }
  }
  GraphPropagator::nbNodes((GraphPropagator *)0x2ae2fb);
  local_158 = 0;
  uStack_150 = 0;
  local_148 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2ae341);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2ae356);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffac0,
           CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
           (value_type *)in_stack_fffffffffffffab0._pt,(allocator_type *)in_stack_fffffffffffffaa8);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2ae38a);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt);
  local_160 = 0;
  while (uVar14 = local_160, uVar4 = vec<vec<int>_>::size(local_28), uVar14 < uVar4) {
    local_164 = 0;
    while( true ) {
      uVar14 = local_164;
      pvVar8 = vec<vec<int>_>::operator[](local_28,local_160);
      uVar4 = vec<int>::size(pvVar8);
      if (uVar4 <= uVar14) break;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](&local_140,(ulong)local_160);
      pvVar8 = vec<vec<int>_>::operator[](local_28,local_160);
      in_stack_fffffffffffffb50 = (FilteredLT *)vec<int>::operator[](pvVar8,local_164);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt,
                 (value_type_conflict *)in_stack_fffffffffffffaa8);
      local_164 = local_164 + 1;
    }
    local_160 = local_160 + 1;
  }
  iVar7 = GraphPropagator::nbNodes((GraphPropagator *)0x2ae539);
  _in_00 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(long)iVar7;
  local_198.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _en_00 = &local_198;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2ae57f);
  puVar15 = &local_199;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2ae594);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffac0,
           CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
           (value_type *)in_stack_fffffffffffffab0._pt,(allocator_type *)in_stack_fffffffffffffaa8);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2ae5c8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt);
  local_1a0 = 0;
  while( true ) {
    uVar14 = local_1a0;
    uVar4 = vec<vec<int>_>::size(local_30);
    iVar5 = (int)((ulong)puVar15 >> 0x20);
    if (uVar4 <= uVar14) break;
    local_1a4 = 0;
    while( true ) {
      uVar14 = local_1a4;
      pvVar8 = vec<vec<int>_>::operator[](local_30,local_1a0);
      uVar4 = vec<int>::size(pvVar8);
      if (uVar4 <= uVar14) break;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](&local_180,(ulong)local_1a0);
      pvVar8 = vec<vec<int>_>::operator[](local_30,local_1a0);
      vec<int>::operator[](pvVar8,local_1a4);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._pt,
                 (value_type_conflict *)in_stack_fffffffffffffaa8);
      local_1a4 = local_1a4 + 1;
    }
    local_1a0 = local_1a0 + 1;
  }
  pFVar13 = (FilteredLT *)operator_new(0x100);
  local_1f1 = 1;
  iVar6 = get_root_idx(in_RDI);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(iVar6,in_stack_fffffffffffffaf0),
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(iVar6,in_stack_fffffffffffffaf0),
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(iVar6,in_stack_fffffffffffffaf0),
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  FilteredLT::FilteredLT
            (in_stack_fffffffffffffb50,(GraphPropagator *)CONCAT44(iVar7,in_stack_fffffffffffffb48),
             iVar5,_en_00,_in_00,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)CONCAT44(uVar4,uVar14));
  local_1f1 = 0;
  in_RDI->lt = pFVar13;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffab0._pt);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffab0._pt);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffab0._pt);
  local_1f8 = 0;
  while (iVar7 = local_1f8, iVar5 = GraphPropagator::nbNodes((GraphPropagator *)0x2ae85d),
        iVar7 < iVar5) {
    GraphPropagator::getNodeVar
              ((GraphPropagator *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               in_stack_fffffffffffffa9c);
    BoolView::attach((BoolView *)in_stack_fffffffffffffab0._pt,in_stack_fffffffffffffaa8,
                     in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0);
    local_1f8 = local_1f8 + 1;
  }
  for (local_1fc = 0; iVar7 = local_1fc,
      iVar5 = GraphPropagator::nbEdges((GraphPropagator *)0x2ae97e), iVar7 < iVar5;
      local_1fc = local_1fc + 1) {
    GraphPropagator::getEdgeVar
              ((GraphPropagator *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               in_stack_fffffffffffffa9c);
    GraphPropagator::nbNodes((GraphPropagator *)0x2ae9b8);
    BoolView::attach((BoolView *)in_stack_fffffffffffffab0._pt,in_stack_fffffffffffffaa8,
                     in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0);
  }
  this_01 = GraphPropagator::getNodeVar
                      ((GraphPropagator *)
                       CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                       in_stack_fffffffffffffa9c);
  bVar3 = BoolView::isFixed((BoolView *)0x2aea20);
  iVar7 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffabc);
  if (bVar3) {
    GraphPropagator::getNodeVar
              ((GraphPropagator *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               in_stack_fffffffffffffa9c);
    bVar3 = BoolView::isFalse((BoolView *)
                              CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
    in_stack_fffffffffffffaa4 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffaa4);
    if (bVar3) goto LAB_002aeb65;
  }
  else {
    in_stack_fffffffffffffab0._pt =
         (Clause *)
         GraphPropagator::getNodeVar
                   ((GraphPropagator *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0)
                    ,in_stack_fffffffffffffa9c);
    Reason::Reason(&local_208,(Clause *)0x0);
    BoolView::setVal((BoolView *)in_stack_fffffffffffffaa8,
                     SUB41((uint)in_stack_fffffffffffffaa4 >> 0x18,0),
                     (Reason)in_stack_fffffffffffffab0);
  }
  Tint::operator=((Tint *)this_01,iVar7);
  add_innode((DReachabilityPropagator *)
             CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),in_stack_fffffffffffffa9c
            );
  local_210 = 0;
  while (uVar14 = local_210, iVar7 = GraphPropagator::nbNodes((GraphPropagator *)0x2aeb19),
        (int)uVar14 < iVar7) {
    (*(in_RDI->super_GraphPropagator).super_Propagator._vptr_Propagator[0xe])
              (in_RDI,(ulong)local_210);
    local_210 = local_210 + 1;
  }
LAB_002aeb65:
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffab0._pt);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffab0._pt);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffab0._pt);
  return;
}

Assistant:

DReachabilityPropagator::DReachabilityPropagator(int _r, vec<BoolView>& _vs, vec<BoolView>& _es,
																								 vec<vec<edge_id> >& _in, vec<vec<edge_id> >& _out,
																								 vec<vec<int> >& _en)
		: GraphPropagator(_vs, _es, _en), root(_r), in_nodes_tsize(0) {
	adj = std::vector<std::vector<int> >(_in.size(), std::vector<int>());
	for (unsigned int i = 0; i < _in.size(); i++) {
		for (unsigned int j = 0; j < _in[i].size(); j++) {
			adj[i].push_back(_in[i][j]);
		}
		for (unsigned int j = 0; j < _out[i].size(); j++) {
			adj[i].push_back(_out[i][j]);
		}
	}

	for (unsigned int i = 0; i < _in.size(); i++) {
		if (DEBUG) {
			std::cout << "Incident to " << i << ": ";
		}
		in.emplace_back();
		for (unsigned int j = 0; j < _in[i].size(); j++) {
			in[i].push_back(_in[i][j]);
			if (DEBUG) {
				std::cout << _in[i][j] << ", ";
			}
		}
		if (DEBUG) {
			std::cout << '\n';
		}
	}

	for (unsigned int i = 0; i < _out.size(); i++) {
		ou.emplace_back();
		if (DEBUG) {
			std::cout << "Outgoing from " << i << ": ";
		}
		for (unsigned int j = 0; j < _out[i].size(); j++) {
			ou[i].push_back(_out[i][j]);
			if (DEBUG) {
				std::cout << _out[i][j] << ", ";
			}
		}
		if (DEBUG) {
			std::cout << '\n';
		}
	}

	nodes2edge = std::vector<std::vector<int> >(nbNodes());
	for (int i = 0; i < nbNodes(); i++) {
		nodes2edge[i] = std::vector<int>(nbNodes(), -1);
	}
	for (int e = 0; e < nbEdges(); e++) {
		nodes2edge[getTail(e)][getHead(e)] = e;
	}

	last_state_n = new Tint[nbNodes()];
	last_state_e = new Tint[nbEdges()];
	memset((int*)last_state_n, UNK, sizeof(Tint) * nbNodes());
	memset((int*)last_state_e, UNK, sizeof(Tint) * nbEdges());

	std::vector<std::vector<int> > en(nbEdges(), std::vector<int>());
	for (unsigned int i = 0; i < _en.size(); i++) {
		for (unsigned int j = 0; j < _en[i].size(); j++) {
			en[i].push_back(_en[i][j]);
		}
	}

	std::vector<std::vector<int> > in(nbNodes(), std::vector<int>());
	for (unsigned int i = 0; i < _in.size(); i++) {
		for (unsigned int j = 0; j < _in[i].size(); j++) {
			in[i].push_back(_in[i][j]);
		}
	}

	std::vector<std::vector<int> > ou(nbNodes(), std::vector<int>());
	for (unsigned int i = 0; i < _out.size(); i++) {
		for (unsigned int j = 0; j < _out[i].size(); j++) {
			ou[i].push_back(_out[i][j]);
		}
	}

	lt = new FilteredLT(this, get_root_idx(), en, in, ou);

	for (int i = 0; i < nbNodes(); i++) {
		getNodeVar(i).attach(this, i, EVENT_LU);
	}

	for (int j = 0; j < nbEdges(); j++) {
		getEdgeVar(j).attach(this, nbNodes() + j, EVENT_LU);
	}

	if (!getNodeVar(root).isFixed()) {
		getNodeVar(root).setVal(true, nullptr);
	} else if (getNodeVar(root).isFalse()) {
		return;  // Will fail anyway because of unreachability.
	}
	last_state_n[root] = VT_IN;
	add_innode(root);

	for (int i = 0; i < nbNodes(); i++) {
		remove_deg1(i);
	}
}